

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mame_fmopl.cpp
# Opt level: O0

void set_mul(FM_OPL *OPL,int slot,int v)

{
  uint8_t uVar1;
  OPL_SLOT *SLOT_00;
  uint32_t uVar2;
  OPL_SLOT *SLOT;
  OPL_CH *CH;
  int v_local;
  int slot_local;
  FM_OPL *OPL_local;
  
  SLOT_00 = OPL->P_CH[slot / 2].SLOT + (int)(slot & 1);
  SLOT_00->mul = "\x01\x02\x04\x06\b\n\f\x0e\x10\x12\x14\x14\x18\x18\x1e\x1e"[(int)(v & 0xf)];
  uVar1 = '\x02';
  if ((v & 0x10U) != 0) {
    uVar1 = '\0';
  }
  SLOT_00->KSR = uVar1;
  SLOT_00->eg_type = (byte)v & 0x20;
  SLOT_00->vib = (byte)v & 0x40;
  uVar2 = 0;
  if ((v & 0x80U) != 0) {
    uVar2 = 0xffffffff;
  }
  SLOT_00->AMmask = uVar2;
  CALC_FCSLOT(OPL->P_CH + slot / 2,SLOT_00);
  return;
}

Assistant:

static inline void set_mul(FM_OPL *OPL,int slot,int v)
{
	OPL_CH   *CH   = &OPL->P_CH[slot/2];
	OPL_SLOT *SLOT = &CH->SLOT[slot&1];

	SLOT->mul     = mul_tab[v&0x0f];
	SLOT->KSR     = (v&0x10) ? 0 : 2;
	SLOT->eg_type = (v&0x20);
	SLOT->vib     = (v&0x40);
	SLOT->AMmask  = (v&0x80) ? ~0 : 0;
	CALC_FCSLOT(CH,SLOT);
}